

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SplitNDLayerParams::SerializeWithCachedSizes
          (SplitNDLayerParams *this,CodedOutputStream *output)

{
  int iVar1;
  int64 iVar2;
  uint64 uVar3;
  int local_20;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  SplitNDLayerParams *this_local;
  
  iVar2 = axis(this);
  if (iVar2 != 0) {
    iVar2 = axis(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(1,iVar2,output);
  }
  uVar3 = numsplits(this);
  if (uVar3 != 0) {
    uVar3 = numsplits(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,uVar3,output);
  }
  iVar1 = splitsizes_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(3,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_splitsizes_cached_byte_size_);
  }
  local_20 = 0;
  iVar1 = splitsizes_size(this);
  for (; local_20 < iVar1; local_20 = local_20 + 1) {
    uVar3 = splitsizes(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(uVar3,output);
  }
  return;
}

Assistant:

void SplitNDLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SplitNDLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 axis = 1;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->axis(), output);
  }

  // uint64 numSplits = 2;
  if (this->numsplits() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->numsplits(), output);
  }

  // repeated uint64 splitSizes = 3;
  if (this->splitsizes_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(3, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_splitsizes_cached_byte_size_);
  }
  for (int i = 0, n = this->splitsizes_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->splitsizes(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SplitNDLayerParams)
}